

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar2;
  CppType *pCVar3;
  CppType *pCVar4;
  MessageLite *pMVar5;
  undefined1 auVar6 [16];
  LogMessageFatal local_138 [23];
  Voidify local_121;
  CppType local_120;
  CppType local_11c;
  string *local_118;
  undefined1 local_110 [16];
  LogMessageFatal local_100 [23];
  Voidify local_e9;
  anon_enum_32 local_e8;
  anon_enum_32 local_e4;
  string *local_e0;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_d0;
  LogMessageFatal local_c8 [23];
  Voidify local_b1;
  CppType local_b0;
  CppType local_ac;
  string *local_a8;
  string *absl_log_internal_check_op_result;
  Extension *extension;
  byte local_81;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  LogMessageFatal local_70 [23];
  Voidify local_59;
  Arena *local_58;
  Arena *message_arena;
  Arena *arena;
  MessageLite *message_local;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_30;
  int number_local;
  ExtensionSet *this_local;
  Arena *local_20;
  Arena *local_18;
  Arena *local_10;
  
  arena = (Arena *)message;
  message_local = (MessageLite *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_30 = this;
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
  }
  else {
    message_arena = this->arena_;
    local_58 = MessageLite::GetArena(message);
    local_81 = 0;
    if (local_58 != (Arena *)0x0 && local_58 != message_arena) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_80,"message_arena == nullptr || message_arena == arena");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x2b5,local_80._M_len,local_80._M_str);
      local_81 = 1;
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_70);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_59,pLVar2);
    }
    if ((local_81 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
    }
    bVar1 = MaybeNewExtension(this,descriptor_local._4_4_,(FieldDescriptor *)message_local,
                              (Extension **)&absl_log_internal_check_op_result);
    if (bVar1) {
      *(FieldType *)&absl_log_internal_check_op_result->_M_string_length = descriptor_local._3_1_;
      local_ac = anon_unknown_58::cpp_type
                           ((FieldType)absl_log_internal_check_op_result->_M_string_length);
      pCVar3 = absl::lts_20240722::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_ac)
      ;
      local_b0 = CPPTYPE_MESSAGE;
      pCVar4 = absl::lts_20240722::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_b0)
      ;
      local_a8 = absl::lts_20240722::log_internal::
                 Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                           (pCVar3,pCVar4,
                            "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (local_a8 != (string *)0x0) {
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a8);
        local_d0 = auVar6._8_8_;
        absl_log_internal_check_op_result_1 = auVar6._0_8_;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                   ,0x2ba,absl_log_internal_check_op_result_1,local_d0);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_c8);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_b1,pLVar2);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c8);
      }
      *(undefined1 *)((long)&absl_log_internal_check_op_result->_M_string_length + 1) = 0;
      *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) =
           *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) & 0xfe | 1;
      *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) =
           *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) & 0xfb;
      if (local_58 == message_arena) {
        *(Arena **)absl_log_internal_check_op_result = arena;
      }
      else if (local_58 == (Arena *)0x0) {
        *(Arena **)absl_log_internal_check_op_result = arena;
        local_10 = message_arena;
        local_18 = arena;
        if (arena != (Arena *)0x0) {
          ThreadSafeArena::AddCleanup
                    ((ThreadSafeArena *)message_arena,arena,
                     arena_delete_object<google::protobuf::MessageLite>);
        }
      }
      else {
        pMVar5 = MessageLite::New((MessageLite *)arena,message_arena);
        *(MessageLite **)absl_log_internal_check_op_result = pMVar5;
        MessageLite::CheckTypeAndMergeFrom
                  (*(MessageLite **)absl_log_internal_check_op_result,(MessageLite *)arena);
      }
    }
    else {
      local_e4 = (anon_enum_32)((absl_log_internal_check_op_result->_M_string_length & 0x100) == 0);
      v1 = absl::lts_20240722::log_internal::
           GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_e4);
      local_e8 = OPTIONAL_FIELD;
      v2 = absl::lts_20240722::log_internal::
           GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_e8);
      local_e0 = absl::lts_20240722::log_internal::
                 Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                           (v1,v2,
                            "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                           );
      if (local_e0 != (string *)0x0) {
        local_110 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                   ,0x2c8,local_110._0_8_,local_110._8_8_);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_100);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_e9,pLVar2);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_100);
      }
      local_11c = anon_unknown_58::cpp_type
                            ((FieldType)absl_log_internal_check_op_result->_M_string_length);
      pCVar3 = absl::lts_20240722::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>
                         (&local_11c);
      local_120 = CPPTYPE_MESSAGE;
      pCVar4 = absl::lts_20240722::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>
                         (&local_120);
      local_118 = absl::lts_20240722::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            (pCVar3,pCVar4,
                             "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (local_118 != (string *)0x0) {
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_118);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                   ,0x2c8,auVar6._0_8_,auVar6._8_8_);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_138);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_121,pLVar2);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_138);
      }
      if ((*(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) >> 2 & 1) == 0)
      {
        if ((message_arena == (Arena *)0x0) &&
           (*(long **)absl_log_internal_check_op_result != (long *)0x0)) {
          (**(code **)(**(long **)absl_log_internal_check_op_result + 8))();
        }
        if (local_58 == message_arena) {
          *(Arena **)absl_log_internal_check_op_result = arena;
        }
        else if (local_58 == (Arena *)0x0) {
          *(Arena **)absl_log_internal_check_op_result = arena;
          local_20 = message_arena;
          this_local = (ExtensionSet *)arena;
          if (arena != (Arena *)0x0) {
            ThreadSafeArena::AddCleanup
                      ((ThreadSafeArena *)message_arena,arena,
                       arena_delete_object<google::protobuf::MessageLite>);
          }
        }
        else {
          pMVar5 = MessageLite::New((MessageLite *)arena,message_arena);
          *(MessageLite **)absl_log_internal_check_op_result = pMVar5;
          MessageLite::CheckTypeAndMergeFrom
                    (*(MessageLite **)absl_log_internal_check_op_result,(MessageLite *)arena);
        }
      }
      else {
        (**(code **)(**(long **)absl_log_internal_check_op_result + 0x30))
                  (*(long **)absl_log_internal_check_op_result,arena,message_arena);
      }
    }
    *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) =
         *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) & 0xfd;
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}